

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O3

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,bool v)

{
  pointer puVar1;
  uchar __tmp;
  
  this->type = 'C';
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(1);
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 1;
  *puVar1 = v;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 1;
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(bool v)
: type('C')
, data(1, uint8_t(v)) {}